

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O3

Fl_Shared_Image * Fl_Shared_Image::get(Fl_RGB_Image *rgb,int own_it)

{
  Fl_Shared_Image *this;
  char *n;
  
  this = (Fl_Shared_Image *)operator_new(0x48);
  n = Fl_Preferences::newUUID();
  Fl_Shared_Image(this,n,&rgb->super_Fl_Image);
  this->alloc_image_ = own_it;
  add(this);
  return this;
}

Assistant:

Fl_Shared_Image *Fl_Shared_Image::get(Fl_RGB_Image *rgb, int own_it)
{
  Fl_Shared_Image *shared = new Fl_Shared_Image(Fl_Preferences::newUUID(), rgb);
  shared->alloc_image_ = own_it;
  shared->add();
  return shared;
}